

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

size_t __thiscall
CVmObjGramProd::build_alt_props_list(CVmObjGramProd *this,vm_obj_id_t match_obj,CVmObjList *lst)

{
  vm_gram_ext *pvVar1;
  long in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjList *in_RDI;
  vm_val_t v;
  size_t j;
  vmgram_tok_info *tok;
  vmgram_alt_info *alt;
  size_t i;
  vmgram_alt_info **alts;
  size_t n;
  ulong idx;
  vm_val_t local_58;
  ulong local_48;
  vmgram_tok_info *local_40;
  vmgram_alt_info *local_38;
  ulong local_30;
  vmgram_alt_info **local_28;
  size_t local_20;
  long local_18;
  vm_obj_id_t local_c;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  pvVar1 = get_ext((CVmObjGramProd *)in_RDI);
  local_28 = pvVar1->alts_;
  local_30 = 0;
  while (idx = local_30, pvVar1 = get_ext((CVmObjGramProd *)in_RDI), idx < pvVar1->alt_cnt_) {
    local_38 = *local_28;
    if ((local_38->del == 0) && (local_38->proc_obj == local_c)) {
      local_40 = local_38->toks;
      for (local_48 = 0; local_48 < local_38->tok_cnt; local_48 = local_48 + 1) {
        if (local_40->prop != 0) {
          if (local_18 != 0) {
            vm_val_t::set_propid(&local_58,local_40->prop);
            CVmObjList::cons_set_element(in_RDI,idx,(vm_val_t *)0x306670);
          }
          local_20 = local_20 + 1;
        }
        local_40 = local_40 + 1;
      }
    }
    local_30 = local_30 + 1;
    local_28 = local_28 + 1;
  }
  return local_20;
}

Assistant:

size_t CVmObjGramProd::build_alt_props_list(
    VMG_ vm_obj_id_t match_obj, CVmObjList *lst)
{
    /* we haven't stored any properties yet */
    size_t n = 0;
    
    /* run through the surviving alternatives */
    vmgram_alt_info **alts = get_ext()->alts_;
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i, ++alts)
    {
        /* 
         *   if this alternative isn't being deleted, and it's associated
         *   with the given match object, add its properties to the list 
         */
        vmgram_alt_info *alt = *alts;
        if (!alt->del && alt->proc_obj == match_obj)
        {
            /* scan its token list */
            vmgram_tok_info *tok = alt->toks;
            for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
            {
                /* if this token has a target property, add it to the list */
                if (tok->prop != VM_INVALID_PROP)
                {
                    /* if we have a list, store it */
                    if (lst != 0)
                    {
                        vm_val_t v;
                        v.set_propid(tok->prop);
                        lst->cons_set_element(n, &v);
                    }
                    
                    /* count it */
                    ++n;
                }
            }
        }
    }

    /* return the number of properties we stored */
    return n;
}